

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ResolveSelfReference(Parse *pParse,Table *pTab,int type,Expr *pExpr,ExprList *pList)

{
  int iVar1;
  NameContext sNC;
  SrcList sSrc;
  NameContext local_c8;
  SrcList local_88;
  
  local_c8.pNext = (NameContext *)0x0;
  local_c8.nRef = 0;
  local_c8.nErr = 0;
  local_c8.pEList = (ExprList *)0x0;
  local_c8.pAggInfo = (AggInfo *)0x0;
  local_c8.pSrcList = &local_88;
  local_88.a[0].pSchema = (Schema *)0x0;
  local_88.a[0].zDatabase = (char *)0x0;
  local_88.a[0].zAlias = (char *)0x0;
  local_88.a[0].pSelect = (Select *)0x0;
  local_88.a[0].addrFillSub = 0;
  local_88.a[0].regReturn = 0;
  local_88.a[0].regResult = 0;
  local_88.a[0].fg = (anon_struct_4_7_7ffbf296_for_fg)0x0;
  local_88.a[0].pOn = (Expr *)0x0;
  local_88.a[0].pUsing = (IdList *)0x0;
  local_88.a[0].colUsed = 0;
  local_88.a[0].u1.zIndexedBy = (char *)0x0;
  local_88.a[0].pIBIndex = (Index *)0x0;
  local_88.nSrc = 1;
  local_88.nAlloc = 0;
  local_88.a[0].zName = pTab->zName;
  local_88.a[0].iSelectId = '\0';
  local_88.a[0]._65_3_ = 0;
  local_88.a[0].iCursor = -1;
  local_c8._50_6_ = 0;
  local_c8.ncFlags = (ushort)type;
  local_c8.pParse = pParse;
  local_88.a[0].pTab = pTab;
  iVar1 = sqlite3ResolveExprNames(&local_c8,pExpr);
  if ((pList != (ExprList *)0x0) && (iVar1 == 0)) {
    sqlite3ResolveExprListNames(&local_c8,pList);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResolveSelfReference(
  Parse *pParse,      /* Parsing context */
  Table *pTab,        /* The table being referenced */
  int type,           /* NC_IsCheck or NC_PartIdx or NC_IdxExpr */
  Expr *pExpr,        /* Expression to resolve.  May be NULL. */
  ExprList *pList     /* Expression list to resolve.  May be NUL. */
){
  SrcList sSrc;                   /* Fake SrcList for pParse->pNewTable */
  NameContext sNC;                /* Name context for pParse->pNewTable */

  assert( type==NC_IsCheck || type==NC_PartIdx || type==NC_IdxExpr );
  memset(&sNC, 0, sizeof(sNC));
  memset(&sSrc, 0, sizeof(sSrc));
  sSrc.nSrc = 1;
  sSrc.a[0].zName = pTab->zName;
  sSrc.a[0].pTab = pTab;
  sSrc.a[0].iCursor = -1;
  sNC.pParse = pParse;
  sNC.pSrcList = &sSrc;
  sNC.ncFlags = type;
  if( sqlite3ResolveExprNames(&sNC, pExpr) ) return;
  if( pList ) sqlite3ResolveExprListNames(&sNC, pList);
}